

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setAttributeValue(QOpenGLShaderProgram *this,int location,QColor *value)

{
  long lVar1;
  QOpenGLShaderProgramPrivate *pQVar2;
  QOpenGLFunctions *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  QOpenGLShaderProgramPrivate *d;
  GLfloat values [4];
  GLuint indx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QOpenGLShaderProgram *)0x17564e);
  indx = (GLuint)((ulong)pQVar2 >> 0x20);
  if (in_ESI != -1) {
    QColor::redF();
    QColor::greenF();
    QColor::blueF();
    QColor::alphaF();
    QOpenGLFunctions::glVertexAttrib4fv(in_RDX,indx,(GLfloat *)0x1756ca);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setAttributeValue(int location, const QColor& value)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    if (location != -1) {
        GLfloat values[4] = {GLfloat(value.redF()), GLfloat(value.greenF()),
                             GLfloat(value.blueF()), GLfloat(value.alphaF())};
        d->glfuncs->glVertexAttrib4fv(location, values);
    }
}